

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O2

unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
 __thiscall
spvtools::
MakeUnique<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::initializer_list<unsigned_int>>
          (spvtools *this,initializer_list<unsigned_int> *args)

{
  iterator puVar1;
  size_type sVar2;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar3;
  
  pvVar3 = (vector<unsigned_int,std::allocator<unsigned_int>> *)::operator_new(0x18);
  puVar1 = args->_M_array;
  sVar2 = args->_M_len;
  *(undefined8 *)pvVar3 = 0;
  *(undefined8 *)(pvVar3 + 8) = 0;
  *(undefined8 *)(pvVar3 + 0x10) = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            (pvVar3,puVar1,puVar1 + sVar2);
  *(vector<unsigned_int,std::allocator<unsigned_int>> **)this = pvVar3;
  return (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}